

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool IfWuMenQi(void)

{
  char cVar1;
  int iVar2;
  __node_base *p_Var3;
  pointer pbVar4;
  bool bVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  char c;
  allocator local_79;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  group_color_cnt;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  res;
  
  group_color_cnt.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  group_color_cnt.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  group_color_cnt.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar11 = 0x20;
  for (uVar6 = 0;
      uVar6 < (ulong)(((long)my_pack_abi_cxx11_.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)my_pack_abi_cxx11_.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x48); uVar6 = uVar6 + 1) {
    c = **(char **)((long)&((my_pack_abi_cxx11_.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p +
                   lVar11);
    std::__cxx11::string::string((string *)&res,&c,&local_79);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&group_color_cnt
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res);
    std::__cxx11::string::~string((string *)&res);
    lVar11 = lVar11 + 0x48;
  }
  easy_make_map(&res,(iterator)
                     group_color_cnt.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                (iterator)
                group_color_cnt.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
  do {
    if ((_Rb_tree_header *)res._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
        &res._M_t._M_impl.super__Rb_tree_header) {
      bVar5 = false;
      p_Var3 = &my_active_card_abi_cxx11_._M_h._M_before_begin;
      while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
        if (((*(char *)&(p_Var3[1]._M_nxt)->_M_nxt == 'J') ||
            (*(char *)&(p_Var3[1]._M_nxt)->_M_nxt == 'F')) && (1 < *(int *)&p_Var3[5]._M_nxt)) {
          bVar5 = true;
        }
      }
      pbVar4 = all_card_abi_cxx11_.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[my_player_id].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = (long)all_card_abi_cxx11_.
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[my_player_id].
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5;
      iVar9 = 0;
      iVar10 = 0;
      iVar8 = 0;
      iVar7 = 0;
      iVar2 = 0;
      while (bVar12 = lVar11 != 0, lVar11 = lVar11 + -1, bVar12) {
        cVar1 = *(pbVar4->_M_dataplus)._M_p;
        if (cVar1 == 'B') {
          iVar2 = iVar2 + 1;
        }
        else if (cVar1 == 'W') {
          iVar7 = iVar7 + 1;
        }
        else if (cVar1 == 'J') {
          iVar10 = iVar10 + 1;
        }
        else if (cVar1 == 'T') {
          iVar8 = iVar8 + 1;
        }
        else if (cVar1 == 'F') {
          iVar9 = iVar9 + 1;
        }
        pbVar4 = pbVar4 + 1;
      }
      bVar5 = (bVar5 && 2 < iVar2) && ((2 < iVar7 && 2 < iVar8) && (2 < iVar10 && 2 < iVar9));
LAB_00113c52:
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&res._M_t);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&group_color_cnt);
      return bVar5;
    }
    if (1 < (int)res._M_t._M_impl.super__Rb_tree_header._M_header._M_left[2]._M_color) {
      bVar5 = false;
      goto LAB_00113c52;
    }
    res._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         std::_Rb_tree_increment(res._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  } while( true );
}

Assistant:

bool IfWuMenQi() {
	int JF_cnt = 0;
	bool flag_color = false;
	vector<string> group_color_cnt;
	for (int i = 0; i < my_pack.size(); ++i) {
		char c = my_pack[i].second.first[0];
		group_color_cnt.push_back(string(&c));
	}
	map<string, int> res = easy_make_map(group_color_cnt.begin(), group_color_cnt.end());
	for (auto itr = res.begin(); itr != res.end(); ++itr) {
		if (itr->second > 1) {
			return false;
		}
	}
	for (auto itr = my_active_card.begin(); itr != my_active_card.end(); ++itr) {
		char color = itr->first[0];
		if (color == 'F' || color == 'J') {
			if (itr->second >= 2)
				JF_cnt = 2;
		}
	}
	int f_cnt = 0;
	int j_cnt = 0;
	int t_cnt = 0;
	int w_cnt = 0;
	int b_cnt = 0;
	for (int j = 0; j < all_card[my_player_id].size(); ++j) {
		switch (all_card[my_player_id][j][0]) {
		case 'F':
			f_cnt++; break;
		case 'J':
			j_cnt++; break;
		case 'T':
			t_cnt++; break;
		case 'B':
			b_cnt++; break;
		case 'W':
			w_cnt++; break;
		}
	}
	if (f_cnt > 2 && j_cnt > 2 && t_cnt > 2 && w_cnt > 2 && b_cnt > 2)
		flag_color = true;
	return JF_cnt == 2 && flag_color;
}